

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void helper_iret_real_x86_64(CPUX86State *env,int shift)

{
  target_ulong tVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  abi_ptr addr;
  uint uVar7;
  uintptr_t unaff_retaddr;
  uint local_34;
  
  tVar1 = env->segs[2].base;
  addr = (env->regs[4] & 0xffff) + tVar1;
  iVar2 = (int)env->regs[4];
  if (shift == 1) {
    uVar7 = 2;
    uVar6 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    local_34 = cpu_ldl_mmuidx_ra_x86_64(env,addr & 0xffffffff,uVar6,unaff_retaddr);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
      uVar7 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar4 = cpu_ldl_mmuidx_ra_x86_64
                      (env,(ulong)((int)tVar1 + (iVar2 + 4U & 0xffff)),uVar7,unaff_retaddr);
    uVar6 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar4 = uVar4 & 0xffff;
    uVar6 = cpu_ldl_mmuidx_ra_x86_64
                      (env,(ulong)((int)tVar1 + (iVar2 + 8U & 0xffff)),uVar6,unaff_retaddr);
    iVar5 = 0xc;
  }
  else {
    uVar7 = 2;
    uVar6 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    local_34 = cpu_lduw_mmuidx_ra_x86_64(env,addr,uVar6,unaff_retaddr);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
      uVar7 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar4 = cpu_lduw_mmuidx_ra_x86_64(env,(iVar2 + 2U & 0xffff) + tVar1,uVar7,unaff_retaddr);
    uVar6 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
      uVar6 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar6 = cpu_lduw_mmuidx_ra_x86_64(env,(iVar2 + 4U & 0xffff) + tVar1,uVar6,unaff_retaddr);
    iVar5 = 6;
  }
  env->regs[4] = (ulong)(iVar2 + iVar5 & 0xffffU | (uint)*(ushort *)((long)env->regs + 0x22) << 0x10
                        );
  env->segs[1].selector = uVar4;
  env->segs[1].base = (ulong)(uVar4 << 4);
  env->eip = (ulong)local_34;
  uVar7 = 0x254300;
  if (((uint)env->eflags >> 0x11 & 1) == 0) {
    uVar7 = 0x257300;
  }
  uVar3 = uVar7 & 0xffff;
  if (shift != 0) {
    uVar3 = uVar7;
  }
  env->cc_src = (ulong)(uVar6 & 0x8d5);
  env->cc_op = 1;
  env->df = 1 - (uVar6 >> 9 & 2);
  env->eflags = (ulong)(uVar3 & uVar6 | 2) | (long)(int)~uVar3 & env->eflags;
  *(byte *)&env->hflags2 = (byte)env->hflags2 & 0xfb;
  return;
}

Assistant:

void helper_iret_real(CPUX86State *env, int shift)
{
    uint32_t sp, new_cs, new_eip, new_eflags, sp_mask;
    target_ulong ssp;
    int eflags_mask;

    sp_mask = 0xffff; /* XXXX: use SS segment size? */
    sp = env->regs[R_ESP];
    ssp = env->segs[R_SS].base;
    if (shift == 1) {
        /* 32 bits */
        POPL_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPL_RA(ssp, sp, sp_mask, new_cs, GETPC());
        new_cs &= 0xffff;
        POPL_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    } else {
        /* 16 bits */
        POPW_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_cs, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    }
    env->regs[R_ESP] = (env->regs[R_ESP] & ~sp_mask) | (sp & sp_mask);
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
    env->eip = new_eip;
    if (env->eflags & VM_MASK) {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | RF_MASK |
            NT_MASK;
    } else {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | IOPL_MASK |
            RF_MASK | NT_MASK;
    }
    if (shift == 0) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    env->hflags2 &= ~HF2_NMI_MASK;
}